

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_shar.c
# Opt level: O1

void shar_quote(archive_string *buf,char *str,int in_shell)

{
  size_t n;
  char cVar1;
  char *p;
  
  cVar1 = *str;
  if (cVar1 != '\0') {
    p = "\"\n\"";
    if (in_shell == 0) {
      p = "\\n";
    }
    do {
      n = strcspn(str,"\n \t\'`\";&<>()|*?{}[]\\$!#^~");
      if (n == 0) {
        if (cVar1 == '\n') {
          archive_strcat(buf,p);
        }
        else {
          archive_strappend_char(buf,'\\');
          archive_strappend_char(buf,*str);
        }
        n = 1;
      }
      else {
        archive_strncat(buf,str,n);
      }
      cVar1 = str[n];
      str = str + n;
    } while (cVar1 != '\0');
  }
  return;
}

Assistant:

static void
shar_quote(struct archive_string *buf, const char *str, int in_shell)
{
	static const char meta[] = "\n \t'`\";&<>()|*?{}[]\\$!#^~";
	size_t len;

	while (*str != '\0') {
		if ((len = strcspn(str, meta)) != 0) {
			archive_strncat(buf, str, len);
			str += len;
		} else if (*str == '\n') {
			if (in_shell)
				archive_strcat(buf, "\"\n\"");
			else
				archive_strcat(buf, "\\n");
			++str;
		} else {
			archive_strappend_char(buf, '\\');
			archive_strappend_char(buf, *str);
			++str;
		}
	}
}